

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O3

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)0>(SerialArena *this,size_t n)

{
  bool bVar1;
  void *pvVar2;
  SerialArena *unaff_R14;
  void *ptr;
  atomic<char_*> local_20;
  
  if ((n & 7) == 0) {
    unaff_R14 = this;
    if ((this->ptr_)._M_b._M_p <= this->limit_) {
      bVar1 = MaybeAllocateAligned(this,n,(void **)&stack0xffffffffffffffe0);
      if (bVar1) {
        return local_20._M_b._M_p._M_p;
      }
      goto LAB_001cae06;
    }
  }
  else {
    AllocateAligned<(google::protobuf::internal::AllocationClient)0>
              ((SerialArena *)&stack0xffffffffffffffe0);
  }
  AllocateAligned<(google::protobuf::internal::AllocationClient)0>();
LAB_001cae06:
  pvVar2 = AllocateAlignedFallback(unaff_R14,n);
  return pvVar2;
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (PROTOBUF_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }